

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O2

int __thiscall
ctemplate::
small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::count(small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
        *this,key_type *key)

{
  uint uVar1;
  _Base_ptr p_Var2;
  ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
  *pMVar3;
  bool bVar4;
  const_iterator cVar5;
  
  cVar5 = find(this,key);
  uVar1 = this->size_;
  if (cVar5.array_iter_ ==
      (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
       *)0x0) {
    p_Var2 = (_Base_ptr)0x0;
    if ((int)uVar1 < 0) {
      p_Var2 = (_Base_ptr)((long)&this->field_2 + 0x10);
    }
    bVar4 = cVar5.hash_iter_._M_node._M_node == p_Var2 && (int)uVar1 < 0;
  }
  else {
    pMVar3 = (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
              *)0x0;
    if (-1 < (int)uVar1) {
      pMVar3 = (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
                *)((long)&this->field_2 + (ulong)uVar1 * 0x10);
    }
    bVar4 = cVar5.array_iter_ == pMVar3;
  }
  return (int)(bVar4 ^ 1);
}

Assistant:

int count(const key_type& key) const {
    return (find(key) == end()) ? 0 : 1;
  }